

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImStb::STB_TEXTEDIT_DELETECHARS(ImGuiInputTextState *obj,int pos,int n)

{
  int iVar1;
  ImWchar *in_text_end;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ImWchar c;
  ImWchar *src;
  ImWchar *dst;
  ImWchar *local_20;
  
  in_text_end = (ImWchar *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * 2);
  iVar1 = ImTextCountUtf8BytesFromStr((ImWchar *)CONCAT44(in_ESI,in_EDX),in_text_end);
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) - iVar1;
  *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) - in_EDX;
  local_20 = (ImWchar *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * 2 + (long)in_EDX * 2);
  while( true ) {
    if (*local_20 == 0) break;
    *in_text_end = *local_20;
    local_20 = local_20 + 1;
    in_text_end = in_text_end + 1;
  }
  *in_text_end = 0;
  return;
}

Assistant:

static void STB_TEXTEDIT_DELETECHARS(STB_TEXTEDIT_STRING* obj, int pos, int n)
{
    ImWchar* dst = obj->TextW.Data + pos;

    // We maintain our buffer length in both UTF-8 and wchar formats
    obj->CurLenA -= ImTextCountUtf8BytesFromStr(dst, dst + n);
    obj->CurLenW -= n;

    // Offset remaining text (FIXME-OPT: Use memmove)
    const ImWchar* src = obj->TextW.Data + pos + n;
    while (ImWchar c = *src++)
        *dst++ = c;
    *dst = '\0';
}